

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-transpose-array.h
# Opt level: O0

int transpose_array(coda_cursor *cursor,void *array,int element_size)

{
  int iVar1;
  void *__src;
  long lVar2;
  long lVar3;
  int local_198;
  int local_194;
  int j_3;
  int j_2;
  int j_1;
  int j;
  uint8_t *dst;
  uint8_t *src;
  long i;
  long index;
  long rdim [9];
  long lStack_118;
  long rsub [9];
  long lStack_c8;
  long multiplier [9];
  long local_78;
  long num_elements;
  int num_dims;
  long dim [8];
  int element_size_local;
  void *array_local;
  coda_cursor *cursor_local;
  
  i = 0;
  dim[7]._4_4_ = element_size;
  iVar1 = coda_cursor_get_array_dim
                    (cursor,(int *)((long)&num_elements + 4),(long *)&stack0xffffffffffffff98);
  if (iVar1 == 0) {
    if (num_elements._4_4_ < 2) {
      cursor_local._4_4_ = 0;
    }
    else {
      local_78 = 1;
      for (src = (uint8_t *)0x0; (long)src < (long)num_elements._4_4_; src = src + 1) {
        local_78 = dim[(long)(src + -1)] * local_78;
        rsub[(long)(src + -1)] = 0;
        rdim[(long)(src + -1)] = dim[((long)(num_elements._4_4_ + -1) - (long)src) + -1];
      }
      if (local_78 < 2) {
        cursor_local._4_4_ = 0;
      }
      else {
        multiplier[(long)num_elements._4_4_ + -1] = 1;
        rdim[(long)num_elements._4_4_ + -1] = 1;
        for (src = (uint8_t *)(long)num_elements._4_4_; 0 < (long)src; src = src + -1) {
          multiplier[(long)(src + -1 + -1)] = multiplier[(long)(src + -1)] * rdim[(long)(src + -1)];
        }
        rdim[(long)num_elements._4_4_ + -1] = 0;
        rsub[(long)num_elements._4_4_ + -1] = 0;
        __src = malloc(local_78 * dim[7]._4_4_);
        if (__src == (void *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                         local_78 * dim[7]._4_4_,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-transpose-array.h"
                         ,0x5d);
          cursor_local._4_4_ = -1;
        }
        else {
          switch(dim[7]._4_4_) {
          case 1:
            for (src = (uint8_t *)0x0; (long)src < local_78; src = src + 1) {
              j_2 = 0;
              *(uint8_t *)((long)__src + i) = *(uint8_t *)((long)array + (long)src);
              i = lStack_c8 + i;
              while (rsub[(long)j_2 + -1] == rdim[(long)j_2 + -1]) {
                rsub[(long)j_2 + -1] = 0;
                lVar2 = (long)j_2;
                lVar3 = (long)j_2;
                j_2 = j_2 + 1;
                i = multiplier[(long)j_2 + -1] + (i - multiplier[lVar2 + -1] * rdim[lVar3 + -1]);
                rsub[(long)j_2 + -1] = rsub[(long)j_2 + -1] + 1;
              }
            }
            break;
          case 2:
            for (src = (uint8_t *)0x0; (long)src < local_78; src = src + 1) {
              j_3 = 0;
              *(undefined2 *)((long)__src + i * 2) = *(undefined2 *)((long)array + (long)src * 2);
              i = lStack_c8 + i;
              while (rsub[(long)j_3 + -1] == rdim[(long)j_3 + -1]) {
                rsub[(long)j_3 + -1] = 0;
                lVar2 = (long)j_3;
                lVar3 = (long)j_3;
                j_3 = j_3 + 1;
                i = multiplier[(long)j_3 + -1] + (i - multiplier[lVar2 + -1] * rdim[lVar3 + -1]);
                rsub[(long)j_3 + -1] = rsub[(long)j_3 + -1] + 1;
              }
            }
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-transpose-array.h"
                          ,0xac,"int transpose_array(const coda_cursor *, void *, int)");
          case 4:
            for (src = (uint8_t *)0x0; (long)src < local_78; src = src + 1) {
              local_194 = 0;
              *(undefined4 *)((long)__src + i * 4) = *(undefined4 *)((long)array + (long)src * 4);
              i = lStack_c8 + i;
              while (rsub[(long)local_194 + -1] == rdim[(long)local_194 + -1]) {
                rsub[(long)local_194 + -1] = 0;
                lVar2 = (long)local_194;
                lVar3 = (long)local_194;
                local_194 = local_194 + 1;
                i = multiplier[(long)local_194 + -1] +
                    (i - multiplier[lVar2 + -1] * rdim[lVar3 + -1]);
                rsub[(long)local_194 + -1] = rsub[(long)local_194 + -1] + 1;
              }
            }
            break;
          case 8:
            for (src = (uint8_t *)0x0; (long)src < local_78; src = src + 1) {
              local_198 = 0;
              *(undefined8 *)((long)__src + i * 8) = *(undefined8 *)((long)array + (long)src * 8);
              i = lStack_c8 + i;
              while (rsub[(long)local_198 + -1] == rdim[(long)local_198 + -1]) {
                rsub[(long)local_198 + -1] = 0;
                lVar2 = (long)local_198;
                lVar3 = (long)local_198;
                local_198 = local_198 + 1;
                i = multiplier[(long)local_198 + -1] +
                    (i - multiplier[lVar2 + -1] * rdim[lVar3 + -1]);
                rsub[(long)local_198 + -1] = rsub[(long)local_198 + -1] + 1;
              }
            }
          }
          memcpy(array,__src,local_78 * dim[7]._4_4_);
          free(__src);
          cursor_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

static int transpose_array(const coda_cursor *cursor, void *array, int element_size)
{
    long dim[CODA_MAX_NUM_DIMS];
    int num_dims;
    long num_elements;
    long multiplier[CODA_MAX_NUM_DIMS + 1];
    long rsub[CODA_MAX_NUM_DIMS + 1];   /* reversed index in multi dim array */
    long rdim[CODA_MAX_NUM_DIMS + 1];   /* reversed order of dim[] */
    long index = 0;
    long i;
    uint8_t *src;
    uint8_t *dst;

    if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
    {
        return -1;
    }

    if (num_dims <= 1)
    {
        /* nothing to do */
        return 0;
    }

    src = (uint8_t *)array;

    num_elements = 1;
    for (i = 0; i < num_dims; i++)
    {
        num_elements *= dim[i];
        rsub[i] = 0;
        rdim[i] = dim[num_dims - 1 - i];
    }
    if (num_elements <= 1)
    {
        /* nothing to do */
        return 0;
    }

    multiplier[num_dims] = 1;
    rdim[num_dims] = 1;
    for (i = num_dims; i > 0; i--)
    {
        multiplier[i - 1] = multiplier[i] * rdim[i];
    }
    rdim[num_dims] = 0;
    rsub[num_dims] = 0;

    dst = (uint8_t *)malloc(num_elements * element_size);
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       num_elements * element_size, __FILE__, __LINE__);
        return -1;
    }

    switch (element_size)
    {
        case 1:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                dst[index] = src[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 2:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint16_t *)dst)[index] = ((uint16_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 4:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint32_t *)dst)[index] = ((uint32_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 8:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint64_t *)dst)[index] = ((uint64_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    memcpy(array, dst, num_elements * element_size);

    free(dst);

    return 0;
}